

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_8_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  uint16_t uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  long lVar60;
  long lVar61;
  short sVar62;
  short sVar67;
  short sVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short sVar71;
  undefined4 uVar72;
  undefined1 auVar73 [12];
  short sVar84;
  short sVar85;
  undefined1 auVar74 [16];
  short sVar86;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined4 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short sVar94;
  short sVar100;
  short sVar101;
  undefined1 auVar99 [16];
  short sVar102;
  short sVar107;
  short sVar108;
  short sVar109;
  undefined1 auVar103 [12];
  short sVar112;
  short sVar113;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ushort uVar114;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  ushort uVar126;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  ushort uVar127;
  undefined1 auVar120 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  short sVar136;
  short sVar137;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  short sVar146;
  short sVar147;
  short sVar148;
  undefined1 auVar138 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  ushort uVar158;
  ushort uVar162;
  ushort uVar164;
  ushort uVar165;
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  ushort uVar169;
  undefined1 auVar161 [16];
  __m128i pq [4];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  ulong uStack_20;
  ulong local_18;
  undefined8 uStack_10;
  short sVar82;
  short sVar83;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar104 [16];
  short sVar110;
  short sVar111;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  short sVar163;
  short sVar170;
  
  auVar63 = *(undefined1 (*) [16])(s + -4);
  puVar1 = s + (long)p + -4;
  uVar29 = *puVar1;
  uVar30 = puVar1[1];
  uVar31 = puVar1[2];
  uVar32 = puVar1[3];
  uVar33 = puVar1[4];
  uVar34 = puVar1[5];
  uVar35 = puVar1[6];
  uVar36 = puVar1[7];
  auVar116 = *(undefined1 (*) [16])(s + (long)(p * 2) + -4);
  lVar61 = (long)(p * 3);
  puVar1 = s + lVar61 + -4;
  uVar37 = *puVar1;
  uVar38 = puVar1[1];
  uVar39 = puVar1[2];
  uVar40 = puVar1[3];
  uVar41 = puVar1[4];
  uVar42 = puVar1[5];
  uVar43 = puVar1[6];
  uVar44 = puVar1[7];
  sVar147 = auVar63._6_2_;
  auVar98._0_12_ = auVar63._0_12_;
  auVar98._12_2_ = sVar147;
  auVar98._14_2_ = uVar32;
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._0_10_ = auVar63._0_10_;
  auVar97._10_2_ = uVar31;
  sVar101 = auVar63._4_2_;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._0_8_ = auVar63._0_8_;
  auVar96._8_2_ = sVar101;
  auVar47._4_8_ = auVar96._8_8_;
  auVar47._2_2_ = uVar30;
  sVar100 = auVar63._2_2_;
  auVar47._0_2_ = sVar100;
  sVar94 = auVar63._0_2_;
  auVar95._0_4_ = CONCAT22(uVar29,sVar94);
  auVar95._4_12_ = auVar47;
  sVar141 = auVar116._6_2_;
  auVar128._0_12_ = auVar116._0_12_;
  auVar128._12_2_ = sVar141;
  auVar128._14_2_ = uVar40;
  auVar118._12_4_ = auVar128._12_4_;
  auVar118._0_10_ = auVar116._0_10_;
  auVar118._10_2_ = uVar39;
  sVar68 = auVar116._4_2_;
  auVar119._10_6_ = auVar118._10_6_;
  auVar119._0_8_ = auVar116._0_8_;
  auVar119._8_2_ = sVar68;
  auVar48._4_8_ = auVar119._8_8_;
  auVar48._2_2_ = uVar38;
  sVar67 = auVar116._2_2_;
  auVar48._0_2_ = sVar67;
  sVar62 = auVar116._0_2_;
  auVar115._0_8_ = auVar95._0_8_;
  auVar115._8_4_ = auVar47._0_4_;
  auVar115._12_4_ = auVar48._0_4_;
  local_28 = auVar115._8_8_;
  local_18 = CONCAT44(CONCAT22(uVar37,sVar62),auVar95._0_4_);
  auVar99._0_8_ = CONCAT44(auVar119._8_4_,auVar96._8_4_);
  auVar99._8_4_ = auVar97._12_4_;
  auVar99._12_4_ = auVar118._12_4_;
  sVar110 = auVar63._8_2_;
  sVar111 = auVar63._10_2_;
  auVar103._0_8_ = CONCAT26(uVar34,CONCAT24(sVar111,CONCAT22(uVar33,sVar110)));
  sVar112 = auVar63._12_2_;
  auVar103._8_2_ = sVar112;
  auVar103._10_2_ = uVar35;
  sVar113 = auVar63._14_2_;
  auVar104._12_2_ = sVar113;
  auVar104._0_12_ = auVar103;
  auVar104._14_2_ = uVar36;
  sVar82 = auVar116._8_2_;
  sVar83 = auVar116._10_2_;
  auVar73._0_8_ = CONCAT26(uVar42,CONCAT24(sVar83,CONCAT22(uVar41,sVar82)));
  sVar84 = auVar116._12_2_;
  auVar73._8_2_ = sVar84;
  auVar73._10_2_ = uVar43;
  sVar85 = auVar116._14_2_;
  auVar138._12_2_ = sVar85;
  auVar138._0_12_ = auVar73;
  auVar138._14_2_ = uVar44;
  auVar116._8_4_ = (int)((ulong)auVar103._0_8_ >> 0x20);
  auVar116._0_8_ = auVar103._0_8_;
  auVar116._12_4_ = (int)((ulong)auVar73._0_8_ >> 0x20);
  auVar70._8_8_ = auVar116._8_8_;
  auVar70._0_8_ = CONCAT44(CONCAT22(uVar41,sVar82),CONCAT22(uVar33,sVar110));
  auVar105._0_8_ = CONCAT44(auVar73._8_4_,auVar103._8_4_);
  auVar105._8_4_ = auVar104._12_4_;
  auVar105._12_4_ = auVar138._12_4_;
  auVar149._0_8_ = auVar99._8_8_;
  auVar149._8_8_ = auVar70._0_8_;
  local_38._8_8_ = auVar70._8_8_;
  local_38._0_8_ = auVar99._0_8_;
  uStack_20 = auVar105._0_8_;
  uStack_10 = auVar105._8_8_;
  auVar63 = *(undefined1 (*) [16])blimit;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar63._0_13_;
  auVar12[0xe] = auVar63[7];
  auVar15[0xc] = auVar63[6];
  auVar15._0_12_ = auVar63._0_12_;
  auVar15._13_2_ = auVar12._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar63._0_11_;
  auVar18._12_3_ = auVar15._12_3_;
  auVar21[10] = auVar63[5];
  auVar21._0_10_ = auVar63._0_10_;
  auVar21._11_4_ = auVar18._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar63._0_9_;
  auVar24._10_5_ = auVar21._10_5_;
  auVar27[8] = auVar63[4];
  auVar27._0_8_ = auVar63._0_8_;
  auVar27._9_6_ = auVar24._9_6_;
  auVar49._7_8_ = 0;
  auVar49._0_7_ = auVar27._8_7_;
  auVar54._1_8_ = SUB158(auVar49 << 0x40,7);
  auVar54[0] = auVar63[3];
  auVar54._9_6_ = 0;
  auVar55._1_10_ = SUB1510(auVar54 << 0x30,5);
  auVar55[0] = auVar63[2];
  auVar55._11_4_ = 0;
  auVar152._3_12_ = SUB1512(auVar55 << 0x20,3);
  auVar152[2] = auVar63[1];
  auVar152[0] = auVar63[0];
  auVar152[1] = 0;
  auVar152[0xf] = 0;
  auVar63 = *(undefined1 (*) [16])limit;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar63._0_13_;
  auVar10[0xe] = auVar63[7];
  auVar13[0xc] = auVar63[6];
  auVar13._0_12_ = auVar63._0_12_;
  auVar13._13_2_ = auVar10._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar63._0_11_;
  auVar16._12_3_ = auVar13._12_3_;
  auVar19[10] = auVar63[5];
  auVar19._0_10_ = auVar63._0_10_;
  auVar19._11_4_ = auVar16._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar63._0_9_;
  auVar22._10_5_ = auVar19._10_5_;
  auVar25[8] = auVar63[4];
  auVar25._0_8_ = auVar63._0_8_;
  auVar25._9_6_ = auVar22._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar25._8_7_;
  auVar56._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar56[0] = auVar63[3];
  auVar56._9_6_ = 0;
  auVar57._1_10_ = SUB1510(auVar56 << 0x30,5);
  auVar57[0] = auVar63[2];
  auVar57._11_4_ = 0;
  auVar28[2] = auVar63[1];
  auVar28._0_2_ = auVar63._0_2_;
  auVar28._3_12_ = SUB1512(auVar57 << 0x20,3);
  auVar151._0_2_ = auVar63._0_2_ & 0xff;
  auVar151._2_13_ = auVar28._2_13_;
  auVar151[0xf] = 0;
  auVar63 = *(undefined1 (*) [16])thresh;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar63._0_13_;
  auVar11[0xe] = auVar63[7];
  auVar14[0xc] = auVar63[6];
  auVar14._0_12_ = auVar63._0_12_;
  auVar14._13_2_ = auVar11._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar63._0_11_;
  auVar17._12_3_ = auVar14._12_3_;
  auVar20[10] = auVar63[5];
  auVar20._0_10_ = auVar63._0_10_;
  auVar20._11_4_ = auVar17._11_4_;
  auVar23[9] = 0;
  auVar23._0_9_ = auVar63._0_9_;
  auVar23._10_5_ = auVar20._10_5_;
  auVar26[8] = auVar63[4];
  auVar26._0_8_ = auVar63._0_8_;
  auVar26._9_6_ = auVar23._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar26._8_7_;
  auVar58._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar58[0] = auVar63[3];
  auVar58._9_6_ = 0;
  auVar59._1_10_ = SUB1510(auVar58 << 0x30,5);
  auVar59[0] = auVar63[2];
  auVar59._11_4_ = 0;
  auVar155._3_12_ = SUB1512(auVar59 << 0x20,3);
  auVar155[2] = auVar63[1];
  auVar155[0] = auVar63[0];
  auVar155[1] = 0;
  auVar155[0xf] = 0;
  auVar63._4_4_ = auVar118._12_4_;
  auVar63._0_4_ = auVar97._12_4_;
  auVar63._8_4_ = auVar96._8_4_;
  auVar63._12_4_ = auVar119._8_4_;
  auVar116 = psubusw(auVar63,auVar70);
  auVar128 = psubusw(auVar70,auVar63);
  auVar128 = auVar128 | auVar116;
  auVar116 = paddusw(auVar128,auVar128);
  auVar117._0_8_ = auVar116._0_8_;
  auVar117._8_8_ = 0;
  auVar129._0_2_ = auVar128._8_2_ >> 1;
  auVar129._2_2_ = auVar128._10_2_ >> 1;
  auVar129._4_2_ = auVar128._12_2_ >> 1;
  auVar129._6_2_ = auVar128._14_2_ >> 1;
  auVar129._8_8_ = 0;
  auVar128 = paddusw(auVar129,auVar117);
  auVar118 = ZEXT416(bd - 8);
  auVar116 = psllw(auVar152,auVar118);
  auVar128 = auVar128 ^ _DAT_004d9b50;
  auVar116 = auVar116 ^ _DAT_004d9b50;
  auVar130._0_2_ = -(ushort)(auVar116._0_2_ < auVar128._0_2_);
  auVar130._2_2_ = -(ushort)(auVar116._2_2_ < auVar128._2_2_);
  auVar130._4_2_ = -(ushort)(auVar116._4_2_ < auVar128._4_2_);
  auVar130._6_2_ = -(ushort)(auVar116._6_2_ < auVar128._6_2_);
  auVar130._8_2_ = -(ushort)(auVar116._8_2_ < auVar128._8_2_);
  auVar130._10_2_ = -(ushort)(auVar116._10_2_ < auVar128._10_2_);
  auVar130._12_2_ = -(ushort)(auVar116._12_2_ < auVar128._12_2_);
  auVar130._14_2_ = -(ushort)(auVar116._14_2_ < auVar128._14_2_);
  auVar152 = psllw(auVar151,auVar118);
  auVar116 = psllw(auVar155,auVar118);
  auVar119 = paddusw(_DAT_005147c0,auVar152);
  auVar119 = auVar119 & auVar130;
  auVar128 = psubusw(auVar149,local_38);
  auVar138 = psubusw(local_38,auVar149);
  auVar138 = auVar138 | auVar128;
  sVar136 = auVar138._0_2_;
  sVar143 = auVar138._8_2_;
  auVar88._0_2_ = (ushort)(sVar143 < sVar136) * sVar136 | (ushort)(sVar143 >= sVar136) * sVar143;
  sVar137 = auVar138._2_2_;
  sVar142 = auVar138._10_2_;
  auVar88._2_2_ = (ushort)(sVar142 < sVar137) * sVar137 | (ushort)(sVar142 >= sVar137) * sVar142;
  sVar140 = auVar138._4_2_;
  sVar144 = auVar138._12_2_;
  auVar88._4_2_ = (ushort)(sVar144 < sVar140) * sVar140 | (ushort)(sVar144 >= sVar140) * sVar144;
  sVar139 = auVar138._6_2_;
  sVar146 = auVar138._14_2_;
  auVar88._6_2_ = (ushort)(sVar146 < sVar139) * sVar139 | (ushort)(sVar146 >= sVar139) * sVar146;
  sVar109 = (ushort)(0 < sVar143) * sVar143;
  auVar88._8_2_ = sVar109;
  sVar102 = (ushort)(0 < sVar142) * sVar142;
  auVar88._10_2_ = sVar102;
  sVar107 = (ushort)(0 < sVar144) * sVar144;
  auVar88._12_2_ = sVar107;
  sVar108 = (ushort)(0 < sVar146) * sVar146;
  auVar88._14_2_ = sVar108;
  sVar145 = auVar119._0_2_;
  uVar114 = (sVar145 < (short)auVar88._0_2_) * auVar88._0_2_ |
            (ushort)(sVar145 >= (short)auVar88._0_2_) * sVar145;
  sVar145 = auVar119._2_2_;
  uVar121 = (sVar145 < (short)auVar88._2_2_) * auVar88._2_2_ |
            (ushort)(sVar145 >= (short)auVar88._2_2_) * sVar145;
  sVar145 = auVar119._4_2_;
  uVar122 = (sVar145 < (short)auVar88._4_2_) * auVar88._4_2_ |
            (ushort)(sVar145 >= (short)auVar88._4_2_) * sVar145;
  sVar145 = auVar119._6_2_;
  uVar123 = (sVar145 < (short)auVar88._6_2_) * auVar88._6_2_ |
            (ushort)(sVar145 >= (short)auVar88._6_2_) * sVar145;
  sVar145 = auVar119._8_2_;
  uVar124 = (ushort)(sVar145 < sVar109) * sVar109 | (ushort)(sVar145 >= sVar109) * sVar145;
  sVar109 = auVar119._10_2_;
  uVar125 = (ushort)(sVar109 < sVar102) * sVar102 | (ushort)(sVar109 >= sVar102) * sVar109;
  sVar102 = auVar119._12_2_;
  sVar109 = auVar119._14_2_;
  uVar126 = (ushort)(sVar102 < sVar107) * sVar107 | (ushort)(sVar102 >= sVar107) * sVar102;
  uVar127 = (ushort)(sVar109 < sVar108) * sVar108 | (ushort)(sVar109 >= sVar108) * sVar109;
  auVar88 = auVar88 ^ _DAT_004d9b50;
  auVar116 = auVar116 ^ _DAT_004d9b50;
  uVar87 = CONCAT22(-(ushort)(auVar116._2_2_ < auVar88._2_2_),
                    -(ushort)(auVar116._0_2_ < auVar88._0_2_));
  lVar60 = 0x20;
  auVar128 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  do {
    auVar138 = psubusw(*(undefined1 (*) [16])(local_48 + lVar60),
                       *(undefined1 (*) [16])(local_58 + lVar60));
    auVar119 = psubusw(*(undefined1 (*) [16])(local_58 + lVar60),
                       *(undefined1 (*) [16])(local_48 + lVar60));
    auVar119 = auVar119 | auVar138;
    sVar102 = auVar119._0_2_;
    uVar114 = (ushort)((short)uVar114 < sVar102) * sVar102 | ((short)uVar114 >= sVar102) * uVar114;
    sVar102 = auVar119._2_2_;
    uVar121 = (ushort)((short)uVar121 < sVar102) * sVar102 | ((short)uVar121 >= sVar102) * uVar121;
    sVar102 = auVar119._4_2_;
    uVar122 = (ushort)((short)uVar122 < sVar102) * sVar102 | ((short)uVar122 >= sVar102) * uVar122;
    sVar102 = auVar119._6_2_;
    uVar123 = (ushort)((short)uVar123 < sVar102) * sVar102 | ((short)uVar123 >= sVar102) * uVar123;
    sVar102 = auVar119._8_2_;
    uVar124 = (ushort)((short)uVar124 < sVar102) * sVar102 | ((short)uVar124 >= sVar102) * uVar124;
    sVar102 = auVar119._10_2_;
    uVar125 = (ushort)((short)uVar125 < sVar102) * sVar102 | ((short)uVar125 >= sVar102) * uVar125;
    sVar102 = auVar119._12_2_;
    uVar126 = (ushort)((short)uVar126 < sVar102) * sVar102 | ((short)uVar126 >= sVar102) * uVar126;
    sVar102 = auVar119._14_2_;
    uVar127 = (ushort)((short)uVar127 < sVar102) * sVar102 | ((short)uVar127 >= sVar102) * uVar127;
    lVar60 = lVar60 + 0x10;
  } while (lVar60 != 0x40);
  auVar128 = pshuflw(auVar128,auVar128,0);
  uVar72 = auVar128._0_4_;
  auVar131._4_4_ = uVar72;
  auVar131._0_4_ = uVar72;
  auVar131._8_4_ = uVar72;
  auVar131._12_4_ = uVar72;
  uVar72 = (undefined4)
           (CONCAT26(-(ushort)(auVar116._6_2_ < auVar88._6_2_),
                     CONCAT24(-(ushort)(auVar116._4_2_ < auVar88._4_2_),uVar87)) >> 0x20);
  auVar154._4_4_ = uVar72;
  auVar154._0_4_ = uVar87;
  auVar154._8_4_ = uVar87;
  auVar154._12_4_ = uVar72;
  auVar89._0_2_ =
       ((short)uVar124 < (short)uVar114) * uVar114 | ((short)uVar124 >= (short)uVar114) * uVar124;
  auVar89._2_2_ =
       ((short)uVar125 < (short)uVar121) * uVar121 | ((short)uVar125 >= (short)uVar121) * uVar125;
  auVar89._4_2_ =
       ((short)uVar126 < (short)uVar122) * uVar122 | ((short)uVar126 >= (short)uVar122) * uVar126;
  auVar89._6_2_ =
       ((short)uVar127 < (short)uVar123) * uVar123 | ((short)uVar127 >= (short)uVar123) * uVar127;
  auVar89._8_2_ = (0 < (short)uVar124) * uVar124;
  auVar89._10_2_ = (0 < (short)uVar125) * uVar125;
  auVar89._12_2_ = (0 < (short)uVar126) * uVar126;
  auVar89._14_2_ = (0 < (short)uVar127) * uVar127;
  auVar128 = psubusw(auVar89,auVar152);
  auVar116 = psllw(_DAT_005147c0,ZEXT416((uint)bd));
  auVar74._8_4_ = 0xffffffff;
  auVar74._0_8_ = 0xffffffffffffffff;
  auVar74._12_4_ = 0xffffffff;
  auVar116 = paddsw(auVar116,auVar74);
  auVar116 = psubsw(auVar116,auVar131);
  auVar119 = psubsw((undefined1  [16])0x0,auVar131);
  auVar63 = psubsw(auVar63,auVar131);
  auVar138 = psubsw(auVar70,auVar131);
  auVar155 = psubsw(auVar63,auVar138);
  sVar163 = auVar116._0_2_;
  sVar102 = auVar155._0_2_;
  uVar114 = (ushort)(sVar163 < sVar102) * sVar163 | (ushort)(sVar163 >= sVar102) * sVar102;
  sVar170 = auVar116._2_2_;
  sVar102 = auVar155._2_2_;
  uVar121 = (ushort)(sVar170 < sVar102) * sVar170 | (ushort)(sVar170 >= sVar102) * sVar102;
  sVar4 = auVar116._4_2_;
  sVar102 = auVar155._4_2_;
  uVar122 = (ushort)(sVar4 < sVar102) * sVar4 | (ushort)(sVar4 >= sVar102) * sVar102;
  sVar5 = auVar116._6_2_;
  sVar102 = auVar155._6_2_;
  uVar123 = (ushort)(sVar5 < sVar102) * sVar5 | (ushort)(sVar5 >= sVar102) * sVar102;
  sVar6 = auVar116._8_2_;
  sVar102 = auVar155._8_2_;
  uVar124 = (ushort)(sVar6 < sVar102) * sVar6 | (ushort)(sVar6 >= sVar102) * sVar102;
  sVar7 = auVar116._10_2_;
  sVar102 = auVar155._10_2_;
  uVar125 = (ushort)(sVar7 < sVar102) * sVar7 | (ushort)(sVar7 >= sVar102) * sVar102;
  sVar8 = auVar116._12_2_;
  sVar102 = auVar155._12_2_;
  sVar107 = auVar155._14_2_;
  uVar126 = (ushort)(sVar8 < sVar102) * sVar8 | (ushort)(sVar8 >= sVar102) * sVar102;
  sVar9 = auVar116._14_2_;
  uVar127 = (ushort)(sVar9 < sVar107) * sVar9 | (ushort)(sVar9 >= sVar107) * sVar107;
  sVar102 = auVar119._0_2_;
  auVar156._0_2_ =
       (ushort)((short)uVar114 < sVar102) * sVar102 | ((short)uVar114 >= sVar102) * uVar114;
  sVar107 = auVar119._2_2_;
  auVar156._2_2_ =
       (ushort)((short)uVar121 < sVar107) * sVar107 | ((short)uVar121 >= sVar107) * uVar121;
  sVar108 = auVar119._4_2_;
  auVar156._4_2_ =
       (ushort)((short)uVar122 < sVar108) * sVar108 | ((short)uVar122 >= sVar108) * uVar122;
  sVar109 = auVar119._6_2_;
  auVar156._6_2_ =
       (ushort)((short)uVar123 < sVar109) * sVar109 | ((short)uVar123 >= sVar109) * uVar123;
  sVar145 = auVar119._8_2_;
  auVar156._8_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  sVar148 = auVar119._10_2_;
  auVar156._10_2_ =
       (ushort)((short)uVar125 < sVar148) * sVar148 | ((short)uVar125 >= sVar148) * uVar125;
  sVar2 = auVar119._12_2_;
  auVar156._12_2_ = (ushort)((short)uVar126 < sVar2) * sVar2 | ((short)uVar126 >= sVar2) * uVar126;
  sVar3 = auVar119._14_2_;
  auVar156._14_2_ = (ushort)((short)uVar127 < sVar3) * sVar3 | ((short)uVar127 >= sVar3) * uVar127;
  auVar116 = psubsw(auVar156 >> 0x40 & auVar154,auVar156);
  auVar116 = psubsw(auVar116,auVar156);
  auVar116 = psubsw(auVar116,auVar156);
  auVar90._0_2_ = -(ushort)(auVar128._0_2_ == 0);
  auVar90._2_2_ = -(ushort)(auVar128._2_2_ == 0);
  auVar90._4_2_ = -(ushort)(auVar128._4_2_ == 0);
  auVar90._6_2_ = -(ushort)(auVar128._6_2_ == 0);
  auVar90._8_2_ = -(ushort)(auVar128._8_2_ == 0);
  auVar90._10_2_ = -(ushort)(auVar128._10_2_ == 0);
  auVar90._12_2_ = -(ushort)(auVar128._12_2_ == 0);
  auVar90._14_2_ = -(ushort)(auVar128._14_2_ == 0);
  sVar71 = auVar116._0_2_;
  uVar114 = (ushort)(sVar163 < sVar71) * sVar163 | (ushort)(sVar163 >= sVar71) * sVar71;
  sVar71 = auVar116._2_2_;
  uVar121 = (ushort)(sVar170 < sVar71) * sVar170 | (ushort)(sVar170 >= sVar71) * sVar71;
  sVar71 = auVar116._4_2_;
  uVar122 = (ushort)(sVar4 < sVar71) * sVar4 | (ushort)(sVar4 >= sVar71) * sVar71;
  sVar71 = auVar116._6_2_;
  uVar123 = (ushort)(sVar5 < sVar71) * sVar5 | (ushort)(sVar5 >= sVar71) * sVar71;
  sVar71 = auVar116._8_2_;
  uVar124 = (ushort)(sVar6 < sVar71) * sVar6 | (ushort)(sVar6 >= sVar71) * sVar71;
  sVar71 = auVar116._10_2_;
  uVar125 = (ushort)(sVar7 < sVar71) * sVar7 | (ushort)(sVar7 >= sVar71) * sVar71;
  sVar71 = auVar116._12_2_;
  sVar86 = auVar116._14_2_;
  uVar126 = (ushort)(sVar8 < sVar71) * sVar8 | (ushort)(sVar8 >= sVar71) * sVar71;
  uVar127 = (ushort)(sVar9 < sVar86) * sVar9 | (ushort)(sVar9 >= sVar86) * sVar86;
  auVar75._0_2_ =
       (ushort)((short)uVar114 < sVar102) * sVar102 | ((short)uVar114 >= sVar102) * uVar114;
  auVar75._2_2_ =
       (ushort)((short)uVar121 < sVar107) * sVar107 | ((short)uVar121 >= sVar107) * uVar121;
  auVar75._4_2_ =
       (ushort)((short)uVar122 < sVar108) * sVar108 | ((short)uVar122 >= sVar108) * uVar122;
  auVar75._6_2_ =
       (ushort)((short)uVar123 < sVar109) * sVar109 | ((short)uVar123 >= sVar109) * uVar123;
  auVar75._8_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  auVar75._10_2_ =
       (ushort)((short)uVar125 < sVar148) * sVar148 | ((short)uVar125 >= sVar148) * uVar125;
  auVar75._12_2_ = (ushort)((short)uVar126 < sVar2) * sVar2 | ((short)uVar126 >= sVar2) * uVar126;
  auVar75._14_2_ = (ushort)((short)uVar127 < sVar3) * sVar3 | ((short)uVar127 >= sVar3) * uVar127;
  auVar75 = auVar75 & auVar90;
  auVar76._0_8_ = auVar75._0_8_;
  auVar76._8_4_ = auVar75._0_4_;
  auVar76._12_4_ = auVar75._4_4_;
  auVar116 = paddsw(auVar76,_DAT_005147d0);
  sVar71 = auVar116._0_2_;
  uVar114 = (ushort)(sVar163 < sVar71) * sVar163 | (ushort)(sVar163 >= sVar71) * sVar71;
  sVar71 = auVar116._2_2_;
  uVar121 = (ushort)(sVar170 < sVar71) * sVar170 | (ushort)(sVar170 >= sVar71) * sVar71;
  sVar71 = auVar116._4_2_;
  uVar122 = (ushort)(sVar4 < sVar71) * sVar4 | (ushort)(sVar4 >= sVar71) * sVar71;
  sVar71 = auVar116._6_2_;
  uVar123 = (ushort)(sVar5 < sVar71) * sVar5 | (ushort)(sVar5 >= sVar71) * sVar71;
  sVar71 = auVar116._8_2_;
  uVar124 = (ushort)(sVar6 < sVar71) * sVar6 | (ushort)(sVar6 >= sVar71) * sVar71;
  sVar71 = auVar116._10_2_;
  uVar125 = (ushort)(sVar7 < sVar71) * sVar7 | (ushort)(sVar7 >= sVar71) * sVar71;
  sVar71 = auVar116._12_2_;
  sVar86 = auVar116._14_2_;
  uVar126 = (ushort)(sVar8 < sVar71) * sVar8 | (ushort)(sVar8 >= sVar71) * sVar71;
  uVar127 = (ushort)(sVar9 < sVar86) * sVar9 | (ushort)(sVar9 >= sVar86) * sVar86;
  auVar77._0_2_ =
       (ushort)((short)uVar114 < sVar102) * sVar102 | ((short)uVar114 >= sVar102) * uVar114;
  auVar77._2_2_ =
       (ushort)((short)uVar121 < sVar107) * sVar107 | ((short)uVar121 >= sVar107) * uVar121;
  auVar77._4_2_ =
       (ushort)((short)uVar122 < sVar108) * sVar108 | ((short)uVar122 >= sVar108) * uVar122;
  auVar77._6_2_ =
       (ushort)((short)uVar123 < sVar109) * sVar109 | ((short)uVar123 >= sVar109) * uVar123;
  auVar77._8_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  auVar77._10_2_ =
       (ushort)((short)uVar125 < sVar148) * sVar148 | ((short)uVar125 >= sVar148) * uVar125;
  auVar77._12_2_ = (ushort)((short)uVar126 < sVar2) * sVar2 | ((short)uVar126 >= sVar2) * uVar126;
  auVar77._14_2_ = (ushort)((short)uVar127 < sVar3) * sVar3 | ((short)uVar127 >= sVar3) * uVar127;
  auVar116 = psraw(auVar77,3);
  auVar159._0_2_ = auVar116._0_2_ + 1;
  auVar159._2_2_ = auVar116._2_2_ + 1;
  auVar159._4_2_ = auVar116._4_2_ + 1;
  auVar159._6_2_ = auVar116._6_2_ + 1;
  auVar159._8_2_ = auVar116._0_2_ + 1;
  auVar159._10_2_ = auVar116._2_2_ + 1;
  auVar159._12_2_ = auVar116._4_2_ + 1;
  auVar159._14_2_ = auVar116._6_2_ + 1;
  auVar128 = psraw(auVar159,1);
  auVar160._8_8_ = SUB168(~auVar154 & auVar128,8);
  auVar160._0_8_ = auVar116._8_8_;
  auVar78._8_8_ = SUB168(~auVar154 & auVar128,0);
  auVar78._0_8_ = auVar116._0_8_;
  auVar116 = psubsw(auVar138,auVar78);
  auVar63 = paddsw(auVar160,auVar63);
  sVar71 = auVar116._0_2_;
  uVar114 = (ushort)(sVar163 < sVar71) * sVar163 | (ushort)(sVar163 >= sVar71) * sVar71;
  sVar71 = auVar116._2_2_;
  uVar121 = (ushort)(sVar170 < sVar71) * sVar170 | (ushort)(sVar170 >= sVar71) * sVar71;
  sVar71 = auVar116._4_2_;
  uVar122 = (ushort)(sVar4 < sVar71) * sVar4 | (ushort)(sVar4 >= sVar71) * sVar71;
  sVar71 = auVar116._6_2_;
  uVar123 = (ushort)(sVar5 < sVar71) * sVar5 | (ushort)(sVar5 >= sVar71) * sVar71;
  sVar71 = auVar116._8_2_;
  uVar124 = (ushort)(sVar6 < sVar71) * sVar6 | (ushort)(sVar6 >= sVar71) * sVar71;
  sVar71 = auVar116._10_2_;
  uVar125 = (ushort)(sVar7 < sVar71) * sVar7 | (ushort)(sVar7 >= sVar71) * sVar71;
  sVar71 = auVar116._12_2_;
  sVar86 = auVar116._14_2_;
  uVar126 = (ushort)(sVar8 < sVar71) * sVar8 | (ushort)(sVar8 >= sVar71) * sVar71;
  uVar127 = (ushort)(sVar9 < sVar86) * sVar9 | (ushort)(sVar9 >= sVar86) * sVar86;
  sVar71 = auVar63._0_2_;
  uVar158 = (ushort)(sVar163 < sVar71) * sVar163 | (ushort)(sVar163 >= sVar71) * sVar71;
  sVar163 = auVar63._2_2_;
  uVar162 = (ushort)(sVar170 < sVar163) * sVar170 | (ushort)(sVar170 >= sVar163) * sVar163;
  sVar163 = auVar63._4_2_;
  uVar164 = (ushort)(sVar4 < sVar163) * sVar4 | (ushort)(sVar4 >= sVar163) * sVar163;
  sVar163 = auVar63._6_2_;
  uVar165 = (ushort)(sVar5 < sVar163) * sVar5 | (ushort)(sVar5 >= sVar163) * sVar163;
  sVar163 = auVar63._8_2_;
  uVar166 = (ushort)(sVar6 < sVar163) * sVar6 | (ushort)(sVar6 >= sVar163) * sVar163;
  sVar163 = auVar63._10_2_;
  uVar167 = (ushort)(sVar7 < sVar163) * sVar7 | (ushort)(sVar7 >= sVar163) * sVar163;
  sVar163 = auVar63._12_2_;
  sVar170 = auVar63._14_2_;
  uVar168 = (ushort)(sVar8 < sVar163) * sVar8 | (ushort)(sVar8 >= sVar163) * sVar163;
  uVar169 = (ushort)(sVar9 < sVar170) * sVar9 | (ushort)(sVar9 >= sVar170) * sVar170;
  auVar153._0_2_ =
       (ushort)((short)uVar114 < sVar102) * sVar102 | ((short)uVar114 >= sVar102) * uVar114;
  auVar153._2_2_ =
       (ushort)((short)uVar121 < sVar107) * sVar107 | ((short)uVar121 >= sVar107) * uVar121;
  auVar153._4_2_ =
       (ushort)((short)uVar122 < sVar108) * sVar108 | ((short)uVar122 >= sVar108) * uVar122;
  auVar153._6_2_ =
       (ushort)((short)uVar123 < sVar109) * sVar109 | ((short)uVar123 >= sVar109) * uVar123;
  auVar153._8_2_ =
       (ushort)((short)uVar124 < sVar145) * sVar145 | ((short)uVar124 >= sVar145) * uVar124;
  auVar153._10_2_ =
       (ushort)((short)uVar125 < sVar148) * sVar148 | ((short)uVar125 >= sVar148) * uVar125;
  auVar153._12_2_ = (ushort)((short)uVar126 < sVar2) * sVar2 | ((short)uVar126 >= sVar2) * uVar126;
  auVar153._14_2_ = (ushort)((short)uVar127 < sVar3) * sVar3 | ((short)uVar127 >= sVar3) * uVar127;
  auVar161._0_2_ =
       (ushort)((short)uVar158 < sVar102) * sVar102 | ((short)uVar158 >= sVar102) * uVar158;
  auVar161._2_2_ =
       (ushort)((short)uVar162 < sVar107) * sVar107 | ((short)uVar162 >= sVar107) * uVar162;
  auVar161._4_2_ =
       (ushort)((short)uVar164 < sVar108) * sVar108 | ((short)uVar164 >= sVar108) * uVar164;
  auVar161._6_2_ =
       (ushort)((short)uVar165 < sVar109) * sVar109 | ((short)uVar165 >= sVar109) * uVar165;
  auVar161._8_2_ =
       (ushort)((short)uVar166 < sVar145) * sVar145 | ((short)uVar166 >= sVar145) * uVar166;
  auVar161._10_2_ =
       (ushort)((short)uVar167 < sVar148) * sVar148 | ((short)uVar167 >= sVar148) * uVar167;
  auVar161._12_2_ = (ushort)((short)uVar168 < sVar2) * sVar2 | ((short)uVar168 >= sVar2) * uVar168;
  auVar161._14_2_ = (ushort)((short)uVar169 < sVar3) * sVar3 | ((short)uVar169 >= sVar3) * uVar169;
  auVar63 = paddsw(auVar153,auVar131);
  auVar138 = paddsw(auVar161,auVar131);
  auVar46._8_8_ = auVar105._0_8_;
  auVar46._0_8_ = local_28;
  auVar116 = psubusw(auVar46,auVar149);
  auVar128 = psubusw(auVar149,auVar46);
  auVar128 = auVar128 | auVar116;
  auVar45._8_8_ = auVar105._8_8_;
  auVar45._0_8_ = local_18;
  auVar116 = psubusw(auVar45,auVar149);
  auVar119 = psubusw(auVar149,auVar45);
  auVar119 = auVar119 | auVar116;
  sVar102 = auVar128._0_2_;
  sVar107 = auVar119._0_2_;
  uVar114 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._2_2_;
  sVar107 = auVar119._2_2_;
  uVar121 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._4_2_;
  sVar107 = auVar119._4_2_;
  uVar122 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._6_2_;
  sVar107 = auVar119._6_2_;
  uVar123 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._8_2_;
  sVar107 = auVar119._8_2_;
  uVar124 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._10_2_;
  sVar107 = auVar119._10_2_;
  uVar125 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._12_2_;
  sVar107 = auVar119._12_2_;
  sVar108 = auVar119._14_2_;
  uVar126 = (ushort)(sVar107 < sVar102) * sVar102 | (ushort)(sVar107 >= sVar102) * sVar107;
  sVar102 = auVar128._14_2_;
  uVar127 = (ushort)(sVar108 < sVar102) * sVar102 | (ushort)(sVar108 >= sVar102) * sVar108;
  uVar114 = (sVar136 < (short)uVar114) * uVar114 | (ushort)(sVar136 >= (short)uVar114) * sVar136;
  uVar121 = (sVar137 < (short)uVar121) * uVar121 | (ushort)(sVar137 >= (short)uVar121) * sVar137;
  uVar122 = (sVar140 < (short)uVar122) * uVar122 | (ushort)(sVar140 >= (short)uVar122) * sVar140;
  uVar123 = (sVar139 < (short)uVar123) * uVar123 | (ushort)(sVar139 >= (short)uVar123) * sVar139;
  uVar124 = (sVar143 < (short)uVar124) * uVar124 | (ushort)(sVar143 >= (short)uVar124) * sVar143;
  uVar125 = (sVar142 < (short)uVar125) * uVar125 | (ushort)(sVar142 >= (short)uVar125) * sVar142;
  uVar126 = (sVar144 < (short)uVar126) * uVar126 | (ushort)(sVar144 >= (short)uVar126) * sVar144;
  uVar127 = (sVar146 < (short)uVar127) * uVar127 | (ushort)(sVar146 >= (short)uVar127) * sVar146;
  auVar64._0_2_ =
       ((short)uVar124 < (short)uVar114) * uVar114 | ((short)uVar124 >= (short)uVar114) * uVar124;
  auVar64._2_2_ =
       ((short)uVar125 < (short)uVar121) * uVar121 | ((short)uVar125 >= (short)uVar121) * uVar125;
  auVar64._4_2_ =
       ((short)uVar126 < (short)uVar122) * uVar122 | ((short)uVar126 >= (short)uVar122) * uVar126;
  auVar64._6_2_ =
       ((short)uVar127 < (short)uVar123) * uVar123 | ((short)uVar127 >= (short)uVar123) * uVar127;
  auVar64._8_2_ = (0 < (short)uVar124) * uVar124;
  auVar64._10_2_ = (0 < (short)uVar125) * uVar125;
  auVar64._12_2_ = (0 < (short)uVar126) * uVar126;
  auVar64._14_2_ = (0 < (short)uVar127) * uVar127;
  auVar116 = psllw(_DAT_005147c0,auVar118);
  auVar116 = psubusw(auVar64,auVar116);
  auVar65._0_2_ = -(ushort)(auVar116._0_2_ == 0);
  auVar65._2_2_ = -(ushort)(auVar116._2_2_ == 0);
  auVar65._4_2_ = -(ushort)(auVar116._4_2_ == 0);
  auVar65._6_2_ = -(ushort)(auVar116._6_2_ == 0);
  auVar65._8_2_ = -(ushort)(auVar116._8_2_ == 0);
  auVar65._10_2_ = -(ushort)(auVar116._10_2_ == 0);
  auVar65._12_2_ = -(ushort)(auVar116._12_2_ == 0);
  auVar65._14_2_ = -(ushort)(auVar116._14_2_ == 0);
  auVar65 = auVar65 & auVar90;
  auVar120._0_8_ = auVar65._0_8_;
  auVar120._8_4_ = auVar65._0_4_;
  auVar120._12_4_ = auVar65._4_4_;
  auVar157._0_2_ = -(ushort)(auVar65._0_2_ == 0);
  auVar157._2_2_ = -(ushort)(auVar65._2_2_ == 0);
  auVar157._4_2_ = -(ushort)(auVar65._4_2_ == 0);
  auVar157._6_2_ = -(ushort)(auVar65._6_2_ == 0);
  auVar157._8_2_ = -(ushort)(auVar65._0_2_ == 0);
  auVar157._10_2_ = -(ushort)(auVar65._2_2_ == 0);
  auVar157._12_2_ = -(ushort)(auVar65._4_2_ == 0);
  auVar157._14_2_ = -(ushort)(auVar65._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar157 >> 7,0) & 1) | (ushort)(SUB161(auVar157 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar157 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar157 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar157 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar157 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar157 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar157 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar157 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar157 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar157 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar157 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar157 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar157 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar157._14_2_ >> 7) & 1) << 0xe | auVar157._14_2_ & 0x8000) !=
      0xffff) {
    sVar136 = sVar101 + sVar100 + sVar147 + sVar94 * 2 + 4;
    sVar139 = uVar31 + uVar30 + uVar32 + uVar29 * 2 + 4;
    sVar142 = sVar68 + sVar67 + sVar141 + sVar62 * 2 + 4;
    sVar145 = uVar39 + uVar38 + uVar40 + uVar37 * 2 + 4;
    sVar102 = sVar110 + sVar111;
    sVar107 = uVar33 + uVar34;
    sVar108 = sVar82 + sVar83;
    sVar109 = uVar41 + uVar42;
    auVar99._0_2_ = sVar101 + sVar102 + sVar136;
    auVar99._2_2_ = uVar31 + sVar107 + sVar139;
    auVar99._4_2_ = sVar68 + sVar108 + sVar142;
    auVar99._6_2_ = uVar39 + sVar109 + sVar145;
    auVar99._8_2_ = sVar147 + 4;
    auVar99._10_2_ = uVar32 + 4;
    auVar99._12_2_ = sVar141 + 4;
    auVar99._14_2_ = uVar40 + 4;
    sVar137 = (sVar136 - sVar94) + sVar112;
    sVar140 = (sVar139 - uVar29) + uVar35;
    sVar143 = (sVar142 - sVar62) + sVar84;
    sVar146 = (sVar145 - uVar37) + uVar43;
    auVar150._0_2_ = (ushort)(sVar147 + sVar102 + sVar137) >> 3;
    auVar150._2_2_ = (ushort)(uVar32 + sVar107 + sVar140) >> 3;
    auVar150._4_2_ = (ushort)(sVar141 + sVar108 + sVar143) >> 3;
    auVar150._6_2_ = (ushort)(uVar40 + sVar109 + sVar146) >> 3;
    auVar150._8_2_ = auVar99._0_2_ >> 3;
    auVar150._10_2_ = auVar99._2_2_ >> 3;
    auVar150._12_2_ = auVar99._4_2_ >> 3;
    auVar150._14_2_ = auVar99._6_2_ >> 3;
    sVar137 = (sVar137 - sVar94) + sVar113;
    sVar141 = (sVar140 - uVar29) + uVar36;
    sVar144 = (sVar143 - sVar62) + sVar85;
    sVar147 = (sVar146 - uVar37) + uVar44;
    sVar140 = (sVar137 - sVar100) + sVar113;
    sVar143 = (sVar141 - uVar30) + uVar36;
    sVar146 = (sVar144 - sVar67) + sVar85;
    sVar148 = (sVar147 - uVar38) + uVar44;
    auVar69._0_2_ = (ushort)(sVar110 + sVar102 + sVar137) >> 3;
    auVar69._2_2_ = (ushort)(uVar33 + sVar107 + sVar141) >> 3;
    auVar69._4_2_ = (ushort)(sVar82 + sVar108 + sVar144) >> 3;
    auVar69._6_2_ = (ushort)(uVar41 + sVar109 + sVar147) >> 3;
    auVar69._8_2_ = (ushort)(sVar111 + sVar102 + sVar140) >> 3;
    auVar69._10_2_ = (ushort)(uVar34 + sVar107 + sVar143) >> 3;
    auVar69._12_2_ = (ushort)(sVar83 + sVar108 + sVar146) >> 3;
    auVar69._14_2_ = (ushort)(uVar42 + sVar109 + sVar148) >> 3;
    auVar79._0_2_ = (ushort)(sVar110 + sVar100 + sVar94 + sVar136) >> 3;
    auVar79._2_2_ = (ushort)(uVar33 + uVar30 + uVar29 + sVar139) >> 3;
    auVar79._4_2_ = (ushort)(sVar82 + sVar67 + sVar62 + sVar142) >> 3;
    auVar79._6_2_ = (ushort)(uVar41 + uVar38 + uVar37 + sVar145) >> 3;
    auVar79._8_2_ = (ushort)((sVar112 - sVar101) + sVar113 + sVar102 + sVar140) >> 3;
    auVar79._10_2_ = (ushort)((uVar35 - uVar31) + uVar36 + sVar107 + sVar143) >> 3;
    auVar79._12_2_ = (ushort)((sVar84 - sVar68) + sVar85 + sVar108 + sVar146) >> 3;
    auVar79._14_2_ = (ushort)((uVar43 - uVar39) + uVar44 + sVar109 + sVar148) >> 3;
    auVar70 = auVar69 & auVar120 | ~auVar120 & auVar63;
    auVar138 = auVar150 & auVar120 | ~auVar120 & auVar138;
    auVar63 = auVar79 & auVar120 | ~auVar120 & auVar46;
    local_28 = auVar63._0_8_;
    auVar105._0_8_ = auVar63._8_8_;
    auVar63 = auVar70;
  }
  auVar135._8_4_ = 0;
  auVar135._0_8_ = local_18;
  auVar135._12_2_ = uVar37;
  auVar135._14_2_ = (short)((ulong)local_28 >> 0x30);
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = local_18;
  auVar134._10_2_ = (short)((ulong)local_28 >> 0x20);
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._8_2_ = sVar62;
  auVar133._0_8_ = local_18;
  auVar52._4_8_ = auVar133._8_8_;
  auVar52._2_2_ = (short)((ulong)local_28 >> 0x10);
  auVar52._0_2_ = uVar29;
  auVar132._0_4_ = CONCAT22((short)local_28,sVar94);
  auVar132._4_12_ = auVar52;
  auVar66._4_4_ = auVar138._8_4_;
  auVar66._0_4_ = auVar138._0_4_;
  auVar66._8_4_ = auVar138._4_4_;
  auVar66._12_4_ = auVar138._12_4_;
  auVar128 = pshufhw(auVar70,auVar66,0x72);
  auVar116 = pshuflw(auVar66,auVar66,0x72);
  auVar80._4_4_ = auVar63._8_4_;
  auVar80._0_4_ = auVar63._0_4_;
  auVar80._8_4_ = auVar63._4_4_;
  auVar80._12_4_ = auVar63._12_4_;
  auVar118 = pshufhw(auVar99,auVar80,0xd8);
  auVar63 = pshuflw(auVar80,auVar80,0xd8);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = auVar105._0_8_;
  auVar93._12_2_ = (short)(auVar105._0_8_ >> 0x30);
  auVar93._14_2_ = uVar44;
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = auVar105._0_8_;
  auVar92._10_2_ = sVar85;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = (short)(auVar105._0_8_ >> 0x20);
  auVar91._0_8_ = auVar105._0_8_;
  auVar53._4_8_ = auVar91._8_8_;
  auVar53._2_2_ = uVar36;
  auVar53._0_2_ = (short)(auVar105._0_8_ >> 0x10);
  auVar106._0_8_ = auVar132._0_8_;
  auVar106._8_4_ = auVar52._0_4_;
  auVar106._12_4_ = auVar116._4_4_;
  auVar81._0_8_ = auVar63._0_8_;
  auVar81._8_4_ = auVar63._4_4_;
  auVar81._12_4_ = auVar53._0_4_;
  *(ulong *)(s + -4) = CONCAT44(auVar116._0_4_,auVar132._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(sVar113,(short)auVar105._0_8_),auVar63._0_4_);
  *(long *)(s + (long)p + -4) = auVar106._8_8_;
  *(long *)(s + (long)p + -4 + 4) = auVar81._8_8_;
  puVar1 = s + (long)(p * 2) + -4;
  *(int *)puVar1 = auVar133._8_4_;
  *(int *)(puVar1 + 2) = auVar128._8_4_;
  *(int *)(puVar1 + 4) = auVar118._8_4_;
  *(int *)(puVar1 + 6) = auVar91._8_4_;
  *(undefined4 *)(s + lVar61) = auVar134._12_4_;
  *(int *)(s + lVar61 + 2) = auVar128._12_4_;
  *(int *)(s + lVar61 + 4) = auVar118._12_4_;
  *(undefined4 *)(s + lVar61 + 6) = auVar92._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i p2, p1, p0, p3, q0;
  __m128i q1q0, p1p0;

  p3 = _mm_loadu_si128((__m128i *)((s - 4) + 0 * p));
  p2 = _mm_loadu_si128((__m128i *)((s - 4) + 1 * p));
  p1 = _mm_loadu_si128((__m128i *)((s - 4) + 2 * p));
  p0 = _mm_loadu_si128((__m128i *)((s - 4) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&p3, &p2, &p1, &p0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  // Loop filtering
  highbd_lpf_internal_8_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4, &q1q0,
                             &p1p0, blimit, limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose8x8_low_sse2(&d0, &d1, &p0, &p1p0, &q1q0, &q0, &d6, &d7, &d0,
                               &d1, &d2, &d3);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), d0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), d1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), d2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), d3);
}